

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTimeCoordinator.cpp
# Opt level: O1

void __thiscall
helics::GlobalTimeCoordinator::sendTimeUpdateRequest(GlobalTimeCoordinator *this,Time triggerTime)

{
  GlobalFederateId sourceId;
  pointer pDVar1;
  long lVar2;
  pointer pDVar3;
  ActionMessage updateTime;
  ActionMessage AStack_e8;
  
  sourceId.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
  ActionMessage::ActionMessage(&AStack_e8,cmd_request_current_time,sourceId,sourceId);
  AStack_e8.counter = (uint16_t)(this->super_BaseTimeCoordinator).sequenceCounter;
  pDVar3 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pDVar1 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pDVar3 != pDVar1) {
    do {
      lVar2 = (pDVar3->super_TimeData).next.internalTimeCode;
      if (lVar2 != 0x7fffffffffffffff && lVar2 <= triggerTime.internalTimeCode) {
        AStack_e8.dest_id.gid = (pDVar3->fedID).gid;
        AStack_e8.source_handle.hid = (pDVar3->super_TimeData).sequenceCounter;
        pDVar3->updateRequested = true;
        (pDVar3->super_TimeData).grantedIteration =
             (this->super_BaseTimeCoordinator).sequenceCounter;
        if ((this->super_BaseTimeCoordinator).sendMessageFunction.super__Function_base._M_manager ==
            (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*(this->super_BaseTimeCoordinator).sendMessageFunction._M_invoker)
                  ((_Any_data *)&(this->super_BaseTimeCoordinator).sendMessageFunction,&AStack_e8);
      }
      pDVar3 = pDVar3 + 1;
    } while (pDVar3 != pDVar1);
  }
  ActionMessage::~ActionMessage(&AStack_e8);
  return;
}

Assistant:

void GlobalTimeCoordinator::sendTimeUpdateRequest(Time triggerTime)
{
    ActionMessage updateTime(CMD_REQUEST_CURRENT_TIME, mSourceId, mSourceId);
    updateTime.counter = sequenceCounter;
    for (auto& dep : dependencies) {
        if (dep.next <= triggerTime && dep.next < cBigTime) {
            updateTime.dest_id = dep.fedID;
            updateTime.setExtraDestData(dep.sequenceCounter);
            dep.updateRequested = true;
            dep.grantedIteration = sequenceCounter;
            sendMessageFunction(updateTime);
        }
    }
}